

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectionAddressFilter.cpp
# Opt level: O2

void __thiscall
KDIS::NETWORK::ConnectionAddressFilter::RemoveAddress(ConnectionAddressFilter *this,KString *A)

{
  iterator __position;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(this->m_Filter)._M_t,A);
  if ((_Rb_tree_header *)__position._M_node != &(this->m_Filter)._M_t._M_impl.super__Rb_tree_header)
  {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->m_Filter,(const_iterator)__position._M_node);
    return;
  }
  return;
}

Assistant:

void ConnectionAddressFilter::RemoveAddress( const KString & A )
{
	set<KString>::iterator itr = m_Filter.find( A );
	if( itr != m_Filter.end() )
	{
		// If we found the address then remove it.
		m_Filter.erase( itr );
	}
}